

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CBufferMapRange<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferMapRange<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  long lVar2;
  void *pvVar3;
  DIResult *pDVar4;
  DILogger *pDVar5;
  uint in_R9D;
  uint in_stack_ffffffffffffeda0;
  CDataArray dataRef;
  int dataHeight;
  int dataWidth;
  DILogger local_1230;
  DIResult result;
  DILogger local_f28;
  DILogger local_da8;
  DILogger local_c28;
  DILogger local_aa8;
  DILogger local_928;
  DILogger local_7a8;
  DILogger local_628;
  DILogger local_4a8;
  DILogger local_328;
  DILogger local_1a8;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,&dataWidth,&dataHeight);
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,0x1e,0x32,in_R9D);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1a8,&result,lVar2);
  DILogger::~DILogger(&local_1a8);
  pvVar3 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,0,
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,1);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1230,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1230,
               (char (*) [68])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL")
    ;
    pDVar5 = &local_1230;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,dataHeight,
                       (uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight,0,
                       in_stack_ffffffffffffeda0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_328,&result,lVar2);
    DILogger::~DILogger(&local_328);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_4a8,&result,lVar2);
    DILogger::~DILogger(&local_4a8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      pDVar4 = &result;
      DIResult::error(&local_1230,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1230,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1230);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_628,&result,lVar2);
    pDVar5 = &local_628;
  }
  DILogger::~DILogger(pDVar5);
  pvVar3 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,0,
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffc,2);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1230,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1230,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    pDVar5 = &local_1230;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,
                       dataHeight / 2,(uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight / 2,0,
                       in_stack_ffffffffffffeda0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_7a8,&result,lVar2);
    DILogger::~DILogger(&local_7a8);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_928,&result,lVar2);
    DILogger::~DILogger(&local_928);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      pDVar4 = &result;
      DIResult::error(&local_1230,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1230,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1230);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_aa8,&result,lVar2);
    pDVar5 = &local_aa8;
  }
  DILogger::~DILogger(pDVar5);
  pvVar3 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2 & 0xfffffffffffffffc,
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffc,2);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1230,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1230,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    pDVar5 = &local_1230;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,
                       dataHeight / 2,(uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight / 2,
                       dataHeight / 4,in_stack_ffffffffffffeda0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_c28,&result,lVar2);
    DILogger::~DILogger(&local_c28);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2 & 0xfffffffffffffffc,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_da8,&result,lVar2);
    DILogger::~DILogger(&local_da8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      pDVar4 = &result;
      DIResult::error(&local_1230,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1230,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1230);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_f28,&result,lVar2);
    pDVar5 = &local_f28;
  }
  DILogger::~DILogger(pDVar5);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)),
							   GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
							   (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)), GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(
				BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2, dataHeight / 4));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT,
												 (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}